

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ShuffleTests(UnitTestImpl *this)

{
  int iVar1;
  TestCase *this_00;
  Random *pRVar2;
  size_type sVar3;
  reference ppTVar4;
  ulong local_18;
  size_t i;
  UnitTestImpl *this_local;
  
  pRVar2 = (Random *)random(this);
  ShuffleRange<int>(pRVar2,0,this->last_death_test_case_ + 1,&this->test_case_indices_);
  pRVar2 = (Random *)random(this);
  iVar1 = this->last_death_test_case_;
  sVar3 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                    (&this->test_cases_);
  ShuffleRange<int>(pRVar2,iVar1 + 1,(int)sVar3,&this->test_case_indices_);
  local_18 = 0;
  while( true ) {
    sVar3 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                      (&this->test_cases_);
    if (sVar3 <= local_18) break;
    ppTVar4 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        (&this->test_cases_,local_18);
    this_00 = *ppTVar4;
    pRVar2 = (Random *)random(this);
    TestCase::ShuffleTests(this_00,pRVar2);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void UnitTestImpl::ShuffleTests() {
  // Shuffles the death test cases.
  ShuffleRange(random(), 0, last_death_test_case_ + 1, &test_case_indices_);

  // Shuffles the non-death test cases.
  ShuffleRange(random(), last_death_test_case_ + 1,
               static_cast<int>(test_cases_.size()), &test_case_indices_);

  // Shuffles the tests inside each test case.
  for (size_t i = 0; i < test_cases_.size(); i++) {
    test_cases_[i]->ShuffleTests(random());
  }
}